

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

bool xercesc_4_0::XMLUri::isValidURI(bool haveBaseURI,XMLCh *uriStr,bool bAllowSpaces)

{
  short sVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  XMLCh testChar;
  XMLSize_t startPos;
  XMLCh *authUriSpec;
  int fragmentIdx;
  int queryIdx;
  int slashIdx;
  int colonIdx;
  bool foundScheme;
  XMLSize_t index;
  XMLSize_t trimmedUriSpecLen;
  XMLCh *trimmedUriSpec;
  XMLCh *pXStack_18;
  bool bAllowSpaces_local;
  XMLCh *uriStr_local;
  bool haveBaseURI_local;
  
  trimmedUriSpecLen = (XMLSize_t)uriStr;
  trimmedUriSpec._7_1_ = bAllowSpaces;
  pXStack_18 = uriStr;
  uriStr_local._6_1_ = haveBaseURI;
  while (bVar2 = XMLChar1_0::isWhitespace(*(XMLCh *)trimmedUriSpecLen), bVar2) {
    trimmedUriSpecLen = trimmedUriSpecLen + 2;
  }
  index = XMLString::stringLen((XMLCh *)trimmedUriSpecLen);
  while ((index != 0 &&
         (bVar2 = XMLChar1_0::isWhitespace(*(XMLCh *)(trimmedUriSpecLen + (index - 1) * 2)), bVar2))
        ) {
    index = index - 1;
  }
  if (index == 0) {
    if ((uriStr_local._6_1_ & 1) == 0) {
      uriStr_local._7_1_ = false;
    }
    else {
      uriStr_local._7_1_ = true;
    }
  }
  else {
    _colonIdx = 0;
    bVar2 = false;
    iVar4 = XMLString::indexOf((XMLCh *)trimmedUriSpecLen,L':');
    iVar5 = XMLString::indexOf((XMLCh *)trimmedUriSpecLen,L'/');
    iVar6 = XMLString::indexOf((XMLCh *)trimmedUriSpecLen,L'?');
    iVar7 = XMLString::indexOf((XMLCh *)trimmedUriSpecLen,L'#');
    if ((((iVar4 < 1) || ((iVar5 < iVar4 && (iVar5 != -1)))) || ((iVar6 < iVar4 && (iVar6 != -1))))
       || ((iVar7 < iVar4 && (iVar7 != -1)))) {
      if ((iVar4 == 0) || (((uriStr_local._6_1_ & 1) == 0 && (iVar7 != 0)))) {
        return false;
      }
    }
    else {
      bVar2 = processScheme((XMLCh *)trimmedUriSpecLen,(XMLSize_t *)&colonIdx);
      if (!bVar2) {
        return false;
      }
      bVar2 = true;
      _colonIdx = _colonIdx + 1;
    }
    if ((_colonIdx == index) ||
       ((bVar2 != false && (*(short *)(trimmedUriSpecLen + _colonIdx * 2) == 0x23)))) {
      uriStr_local._7_1_ = false;
    }
    else {
      if ((_colonIdx + 1 < index) &&
         (bVar3 = XMLString::startsWith((XMLCh *)(trimmedUriSpecLen + _colonIdx * 2),L"//"), bVar3))
      {
        uVar8 = _colonIdx + 2;
        for (_colonIdx = uVar8;
            (((_colonIdx < index &&
              (sVar1 = *(short *)(trimmedUriSpecLen + _colonIdx * 2), sVar1 != 0x2f)) &&
             (sVar1 != 0x3f)) && (sVar1 != 0x23)); _colonIdx = _colonIdx + 1) {
        }
        if ((uVar8 < _colonIdx) &&
           (bVar3 = processAuthority((XMLCh *)(trimmedUriSpecLen + uVar8 * 2),_colonIdx - uVar8),
           !bVar3)) {
          return false;
        }
      }
      if ((index <= _colonIdx) ||
         (bVar2 = processPath((XMLCh *)(trimmedUriSpecLen + _colonIdx * 2),index - _colonIdx,bVar2,
                              (bool)(trimmedUriSpec._7_1_ & 1)), bVar2)) {
        uriStr_local._7_1_ = true;
      }
      else {
        uriStr_local._7_1_ = false;
      }
    }
  }
  return uriStr_local._7_1_;
}

Assistant:

bool XMLUri::isValidURI(bool haveBaseURI, const XMLCh* const uriStr, bool bAllowSpaces/*=false*/)
{
    // get a trimmed version of uriStr
    // uriStr will NO LONGER be used in this function.
    const XMLCh* trimmedUriSpec = uriStr;

    while (XMLChar1_0::isWhitespace(*trimmedUriSpec))
        trimmedUriSpec++;

    XMLSize_t trimmedUriSpecLen = XMLString::stringLen(trimmedUriSpec);

    while (trimmedUriSpecLen) {
        if (XMLChar1_0::isWhitespace(trimmedUriSpec[trimmedUriSpecLen-1]))
            trimmedUriSpecLen--;
        else
            break;
    }

    if (trimmedUriSpecLen == 0)
    {
        if (!haveBaseURI)
            return false;
        return true;
    }

    XMLSize_t index = 0;
    bool foundScheme = false;

    // Check for scheme, which must be before `/', '?' or '#'.
    int colonIdx = XMLString::indexOf(trimmedUriSpec, chColon);
    int slashIdx = XMLString::indexOf(trimmedUriSpec, chForwardSlash);
    int queryIdx = XMLString::indexOf(trimmedUriSpec, chQuestion);
    int fragmentIdx = XMLString::indexOf(trimmedUriSpec, chPound);

    if ((colonIdx <= 0) ||
        (colonIdx > slashIdx && slashIdx != -1) ||
        (colonIdx > queryIdx && queryIdx != -1) ||
        (colonIdx > fragmentIdx && fragmentIdx != -1))
    {
        // A standalone base is a valid URI according to spec
        if (colonIdx == 0 || (!haveBaseURI && fragmentIdx != 0))
            return false;
    }
    else
    {
        if (!processScheme(trimmedUriSpec, index))
            return false;
        foundScheme = true;
        ++index;
    }

    // It's an error if we stop here
    if (index == trimmedUriSpecLen || (foundScheme && (trimmedUriSpec[index] == chPound)))
        return false;

	// two slashes means generic URI syntax, so we get the authority
    const XMLCh* authUriSpec = trimmedUriSpec +  index;
    if (((index+1) < trimmedUriSpecLen) &&
        XMLString::startsWith(authUriSpec, DOUBLE_SLASH))
    {
        index += 2;
        XMLSize_t startPos = index;

        // get authority - everything up to path, query or fragment
        XMLCh testChar;
        while (index < trimmedUriSpecLen)
        {
            testChar = trimmedUriSpec[index];
            if (testChar == chForwardSlash ||
                testChar == chQuestion     ||
                testChar == chPound         )
            {
                break;
            }

            index++;
        }

        // if we found authority, parse it out, otherwise we set the
        // host to empty string
        if (index > startPos)
        {
            if (!processAuthority(trimmedUriSpec + startPos, index - startPos))
                return false;
        }
    }

    // we need to check if index has exceed the length or not
    if (index < trimmedUriSpecLen)
    {
        if (!processPath(trimmedUriSpec + index, trimmedUriSpecLen - index, foundScheme, bAllowSpaces))
            return false;
    }

    return true;
}